

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseConst(WastParser *this,Const *const_,ConstType const_type)

{
  char *pcVar1;
  Opcode OVar2;
  Result RVar3;
  Literal *pLVar4;
  allocator<char> local_129;
  size_t local_128;
  char *pcStack_120;
  size_t local_118;
  undefined8 uStack_110;
  uint32_t u32;
  undefined8 uStack_100;
  undefined8 local_f8;
  Token token_1;
  Token token;
  Token opcode_token;
  
  Consume(&opcode_token,this);
  OVar2 = Token::opcode(&opcode_token);
  GetLocation(&token.loc,this);
  (const_->loc).field_1.field_1.offset = (size_t)token.loc.field_1.field_1.offset;
  *(undefined8 *)((long)&(const_->loc).field_1 + 8) = token.loc.field_1._8_8_;
  (const_->loc).filename._M_len = token.loc.filename._M_len;
  (const_->loc).filename._M_str = token.loc.filename._M_str;
  GetToken(&token,this);
  if (OVar2.enum_ == V128Const) {
    ErrorUnlessOpcodeEnabled(this,&opcode_token);
    RVar3 = ParseSimdV128Const(this,const_,token.token_type_,const_type);
    return (Result)(uint)(RVar3.enum_ == Error);
  }
  if ((0x3b < (ulong)token.token_type_) ||
     ((0xe00000c00000000U >> ((ulong)token.token_type_ & 0x3f) & 1) == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&token_1,"a numeric literal",&local_129);
    _u32 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&u32,&token_1,
               &token_1.token_type_);
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&u32,"123, -45, 6.7e8");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&u32);
    std::__cxx11::string::_M_dispose();
    return (Result)RVar3.enum_;
  }
  switch(OVar2.enum_) {
  case I32Const:
    Consume(&token_1,this);
    if (token_1.token_type_ - First_Literal < 3) {
      pLVar4 = Token::literal(&token_1);
      pcVar1 = (pLVar4->text)._M_str;
      RVar3 = ParseInt32(pcVar1,pcVar1 + (pLVar4->text)._M_len,&u32,SignedAndUnsigned);
      Const::set_u32(const_,u32);
      goto LAB_001833f8;
    }
    break;
  case I64Const:
    Consume(&token_1,this);
    if (token_1.token_type_ - First_Literal < 3) {
      pLVar4 = Token::literal(&token_1);
      pcVar1 = (pLVar4->text)._M_str;
      RVar3 = ParseInt64(pcVar1,pcVar1 + (pLVar4->text)._M_len,(uint64_t *)&u32,SignedAndUnsigned);
      Const::set_u64(const_,_u32);
      goto LAB_001833f8;
    }
    break;
  case F32Const:
    RVar3 = ParseF32(this,const_,const_type);
    goto LAB_001833f8;
  case F64Const:
    RVar3 = ParseF64(this,const_,const_type);
    goto LAB_001833f8;
  default:
    __assert_fail("!\"ParseConst called with invalid opcode\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0xb85,"Result wabt::WastParser::ParseConst(Const *, ConstType)");
  }
  RVar3.enum_ = Error;
LAB_001833f8:
  if (RVar3.enum_ == Error) {
    local_128 = (const_->loc).filename._M_len;
    pcStack_120 = (const_->loc).filename._M_str;
    local_118 = (const_->loc).field_1.field_1.offset;
    uStack_110 = *(undefined8 *)((long)&(const_->loc).field_1 + 8);
    Token::to_string_abi_cxx11_((string *)&token_1,&token);
    Error(this,0x1e047a,(char *)token_1.loc.filename._M_len);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

Result WastParser::ParseConst(Const* const_, ConstType const_type) {
  WABT_TRACE(ParseConst);
  Token opcode_token = Consume();
  Opcode opcode = opcode_token.opcode();
  const_->loc = GetLocation();
  Token token = GetToken();

  // V128 is fully handled by ParseSimdV128Const:
  if (opcode != Opcode::V128Const) {
    switch (token.token_type()) {
      case TokenType::Nat:
      case TokenType::Int:
      case TokenType::Float:
        // OK.
        break;
      case TokenType::NanArithmetic:
      case TokenType::NanCanonical:
        break;
      default:
        return ErrorExpected({"a numeric literal"}, "123, -45, 6.7e8");
    }
  }

  Result result;
  switch (opcode) {
    case Opcode::I32Const: {
      auto token = Consume();
      if (!token.HasLiteral()) {
        result = Result::Error;
        break;
      }
      auto sv = token.literal().text;
      uint32_t u32;
      result = ParseInt32(sv, &u32, ParseIntType::SignedAndUnsigned);
      const_->set_u32(u32);
      break;
    }

    case Opcode::I64Const: {
      auto token = Consume();
      if (!token.HasLiteral()) {
        result = Result::Error;
        break;
      }
      auto sv = token.literal().text;
      uint64_t u64;
      result = ParseInt64(sv, &u64, ParseIntType::SignedAndUnsigned);
      const_->set_u64(u64);
      break;
    }

    case Opcode::F32Const:
      result = ParseF32(const_, const_type);
      break;

    case Opcode::F64Const:
      result = ParseF64(const_, const_type);
      break;

    case Opcode::V128Const:
      ErrorUnlessOpcodeEnabled(opcode_token);
      // Parse V128 Simd Const (16 bytes).
      result = ParseSimdV128Const(const_, token.token_type(), const_type);
      // ParseSimdV128Const report error already, just return here if parser get
      // errors.
      if (Failed(result)) {
        return Result::Error;
      }
      break;

    default:
      assert(!"ParseConst called with invalid opcode");
      return Result::Error;
  }

  if (Failed(result)) {
    Error(const_->loc, "invalid literal \"%s\"", token.to_string().c_str());
    // Return if parser get errors.
    return Result::Error;
  }

  return Result::Ok;
}